

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_4::PtexSeparableKernel::downresU(PtexSeparableKernel *this)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  
  pfVar3 = this->ku;
  uVar1 = this->u;
  pfVar4 = pfVar3;
  if ((uVar1 & 1) != 0) {
    pfVar4 = pfVar3 + 1;
    this->uw = this->uw + -1;
  }
  uVar2 = this->uw;
  pfVar5 = pfVar4;
  if (1 < (int)uVar2) {
    iVar6 = (uVar2 >> 1) + 1;
    do {
      *pfVar4 = *pfVar5 + pfVar5[1];
      pfVar4 = pfVar4 + 1;
      pfVar5 = pfVar5 + 2;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  if ((uVar2 & 1) != 0) {
    *pfVar4 = *pfVar5;
    pfVar4 = pfVar4 + 1;
  }
  this->u = (int)uVar1 / 2;
  this->uw = (int)((ulong)((long)pfVar4 - (long)pfVar3) >> 2);
  (this->res).ulog2 = (this->res).ulog2 + -1;
  return;
}

Assistant:

void downresU()
    {
        float* src = ku;
        float* dst = ku;

        // skip odd leading sample (if any)
        if (u & 1) {
            dst++;
            src++;
            uw--;
        }

        // combine even pairs
        for (int i = uw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (uw & 1) {
            *dst++ = *src++;
        }

        // update state
        u /= 2;
        uw = int(dst - ku);
        res.ulog2--;
    }